

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.cpp
# Opt level: O2

page * __thiscall page::operator=(page *this,page *p)

{
  int i;
  uint8_t *puVar1;
  ulong uVar2;
  byte bVar3;
  
  if (this != p) {
    ~page(this);
    this->pageID = p->pageID;
    this->numRecords = p->numRecords;
    bVar3 = p->slotSize;
    this->slotSize = bVar3;
    this->recordSize = p->recordSize;
    puVar1 = (uint8_t *)operator_new__((ulong)bVar3);
    this->slots = puVar1;
    for (uVar2 = 0; uVar2 < bVar3; uVar2 = uVar2 + 1) {
      this->slots[uVar2] = p->slots[uVar2];
      bVar3 = this->slotSize;
    }
  }
  return this;
}

Assistant:

page &page::operator=(const page &p) {
    if(this != &p) {
        this->~page();

        pageID = p.pageID;
        numRecords = p.numRecords;
        slotSize = p.slotSize;
        recordSize = p.recordSize;

        slots = new uint8_t[slotSize];

        for (int i = 0; i < slotSize; ++i) {
            slots[i] = p.slots[i];
        }
    }

    return *this;
}